

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O2

void * __thiscall
tchecker::
pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
::allocate(pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
           *this)

{
  pointer psVar1;
  undefined8 *puVar2;
  shared_ptr<tchecker::collectable_t> *collectable;
  pointer psVar3;
  
  if (this->_raw_head == this->_raw_end) {
    if (this->_free_head == (char *)0x0) {
      psVar1 = (this->_collectables).
               super__Vector_base<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar3 = (this->_collectables).
                    super__Vector_base<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1
          ) {
        (*((psVar3->super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->_vptr_collectable_t[2])();
      }
      collect(this);
      if (this->_free_head == (char *)0x0) {
        allocate_raw_block(this);
        goto LAB_001281b6;
      }
    }
    puVar2 = (undefined8 *)allocate_chunk_from_free_list(this);
  }
  else {
LAB_001281b6:
    puVar2 = (undefined8 *)allocate_chunk_from_raw_block(this);
  }
  *puVar2 = 0;
  return puVar2;
}

Assistant:

inline void * allocate()
  {
    // Allocate from the raw block if possible
    if (_raw_head != _raw_end) {
      typename T::refcount_t * chunk = reinterpret_cast<typename T::refcount_t *>(allocate_chunk_from_raw_block());
      *chunk = 0; // set reference counter
      return chunk;
    }

    // Allocate from the free list, collect first if needed
    if (_free_head == nullptr) {
      // collect unsued objects from registered collectables
      for (std::shared_ptr<tchecker::collectable_t> const & collectable : _collectables)
        collectable->collect();
      // then collect free chunks of memory
      collect();
    }

    if (_free_head != nullptr) {
      typename T::refcount_t * chunk = reinterpret_cast<typename T::refcount_t *>(allocate_chunk_from_free_list());
      *chunk = 0; // set reference counter
      return chunk;
    }

    // Allocate a new raw block, and allocate from the block
    allocate_raw_block();
    typename T::refcount_t * chunk = reinterpret_cast<typename T::refcount_t *>(allocate_chunk_from_raw_block());
    *chunk = 0; // set reference counter
    return chunk;
  }